

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperationSingleQueueTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::synchronization::anon_unknown_2::FenceTestInstance::iterate
          (TestStatus *__return_storage_ptr__,FenceTestInstance *this)

{
  deUint32 dVar1;
  long *plVar2;
  PtrData<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  data;
  PtrData<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  data_00;
  undefined4 uVar3;
  pointer pQVar4;
  VkQueueFlags flagsWrite;
  VkQueueFlags flagsRead;
  uint uVar5;
  uint uVar6;
  int iVar7;
  OperationContext *pOVar8;
  DeviceInterface *vk_00;
  MultiQueues *this_00;
  size_type sVar9;
  Resource *pRVar10;
  Resource *pRVar11;
  const_reference pvVar12;
  Handle<(vk::HandleType)24> *pHVar13;
  VkCommandBuffer_s **ppVVar14;
  Operation *pOVar15;
  VkAccessFlags extraout_var;
  VkAccessFlags extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  void *a;
  void *b;
  MovePtr *this_01;
  deUint32 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  VkSharingMode in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  VkAllocationCallbacks **local_458;
  VkCommandPool *local_440;
  allocator<char> local_261;
  string local_260;
  uint local_240;
  allocator<char> local_239;
  string local_238;
  undefined8 local_218;
  Data actual;
  Data expected;
  undefined1 local_1e8 [8];
  SyncInfo readSync;
  undefined1 local_1c8 [8];
  SyncInfo writeSync;
  VkCommandBuffer cmdBuffers [2];
  undefined1 local_188 [8];
  Move<vk::VkCommandBuffer_s_*> ptrCmdBuffer [2];
  undefined1 local_138 [8];
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool [2];
  PtrData<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  local_f0;
  PtrData<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  *local_e0;
  undefined1 local_d0 [8];
  UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  readOp;
  undefined1 local_a0 [8];
  UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  writeOp;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88 [2];
  undefined1 local_58 [8];
  UniquePtr<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
  resource;
  undefined1 local_40 [4];
  deUint32 pairNdx;
  vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
  queuePairs;
  VkDevice device;
  DeviceInterface *vk;
  FenceTestInstance_conflict *this_local;
  
  pOVar8 = de::details::
           UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
           ::operator->((UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
                         *)&(this->super_BaseTestInstance).m_opContext.m_physicalDevice);
  vk_00 = OperationContext::getDeviceInterface(pOVar8);
  pOVar8 = de::details::
           UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
           ::operator->((UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
                         *)&(this->super_BaseTestInstance).m_opContext.m_physicalDevice);
  queuePairs.
  super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)OperationContext::getDevice(pOVar8);
  this_00 = de::details::
            UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
            ::operator->((UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
                          *)&(this->super_BaseTestInstance).m_opContext);
  pRVar10 = (this->super_BaseTestInstance).m_resource.
            super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
            .m_data.ptr;
  pOVar8 = de::details::
           UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
           ::operator*((UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
                        *)&(this->super_BaseTestInstance).m_opContext.m_physicalDevice);
  flagsWrite = (**(code **)(*(long *)pRVar10 + 0x18))(pRVar10,pOVar8);
  plVar2 = *(long **)&(this->super_BaseTestInstance).m_resource.
                      super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                      .m_data.field_0x8;
  pOVar8 = de::details::
           UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
           ::operator*((UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
                        *)&(this->super_BaseTestInstance).m_opContext.m_physicalDevice);
  flagsRead = (**(code **)(*plVar2 + 0x18))(plVar2,pOVar8);
  MultiQueues::getQueuesPairs
            ((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
              *)local_40,this_00,flagsWrite,flagsRead);
  for (resource.
       super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
       .m_data._12_4_ = 0;
      uVar3 = resource.
              super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
              .m_data._12_4_,
      sVar9 = std::
              vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
              ::size((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                      *)local_40), (uint)uVar3 < (uint)sVar9;
      resource.
      super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
      .m_data._12_4_ =
           resource.
           super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
           .m_data._12_4_ + 1) {
    pRVar10 = (Resource *)operator_new(0x80);
    writeOp.
    super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    .m_data._15_1_ = 1;
    pOVar8 = de::details::
             UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
             ::operator*((UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
                          *)&(this->super_BaseTestInstance).m_opContext.m_physicalDevice);
    uVar5 = (**(code **)(*(long *)(this->super_BaseTestInstance).m_resource.
                                  super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                  .m_data.ptr + 0x10))();
    uVar6 = (**(code **)(**(long **)&(this->super_BaseTestInstance).m_resource.
                                     super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                     .m_data.field_0x8 + 0x10))();
    local_88[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(local_88);
    Resource::Resource(pRVar10,pOVar8,
                       (ResourceDescription *)
                       &(this->super_BaseTestInstance).m_opContext.m_allocator,uVar5 | uVar6,
                       VK_SHARING_MODE_EXCLUSIVE,local_88);
    writeOp.
    super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    .m_data._15_1_ = 0;
    de::DefaultDeleter<vkt::synchronization::Resource>::DefaultDeleter
              ((DefaultDeleter<vkt::synchronization::Resource> *)
               &writeOp.
                super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                .m_data.field_0xe);
    de::details::
    UniquePtr<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>::
    UniquePtr((UniquePtr<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
               *)local_58,pRVar10);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(local_88);
    pRVar10 = (this->super_BaseTestInstance).m_resource.
              super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
              .m_data.ptr;
    pOVar8 = de::details::
             UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
             ::operator*((UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
                          *)&(this->super_BaseTestInstance).m_opContext.m_physicalDevice);
    pRVar11 = de::details::
              UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
              ::operator*((UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                           *)local_58);
    (**(code **)(*(long *)pRVar10 + 0x28))
              (&readOp.
                super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                .m_data.field_0x8,pRVar10,pOVar8,pRVar11);
    de::details::MovePtr::operator_cast_to_PtrData
              ((PtrData<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                *)&readOp.
                   super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                   .m_data.field_0x8,(MovePtr *)pRVar10);
    data.ptr._4_4_ = in_stack_fffffffffffffb4c;
    data.ptr._0_4_ = in_stack_fffffffffffffb48;
    data._8_4_ = in_stack_fffffffffffffb50;
    data._12_4_ = in_stack_fffffffffffffb54;
    de::details::
    UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    ::UniquePtr((UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                 *)local_a0,data);
    de::details::
    MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>::
    ~MovePtr((MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
              *)&readOp.
                 super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                 .m_data.field_0x8);
    this_01 = *(MovePtr **)
               &(this->super_BaseTestInstance).m_resource.
                super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                .m_data.field_0x8;
    pOVar8 = de::details::
             UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
             ::operator*((UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
                          *)&(this->super_BaseTestInstance).m_opContext.m_physicalDevice);
    pRVar10 = de::details::
              UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
              ::operator*((UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                           *)local_58);
    (**(code **)(*(long *)this_01 + 0x28))(&local_f0,this_01,pOVar8,pRVar10);
    local_e0 = de::details::MovePtr::operator_cast_to_PtrData(&local_f0,this_01);
    data_00.ptr._4_4_ = in_stack_fffffffffffffb4c;
    data_00.ptr._0_4_ = in_stack_fffffffffffffb48;
    data_00._8_4_ = in_stack_fffffffffffffb50;
    data_00._12_4_ = in_stack_fffffffffffffb54;
    de::details::
    UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    ::UniquePtr((UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                 *)local_d0,data_00);
    de::details::
    MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>::
    ~MovePtr((MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
              *)&local_f0);
    pQVar4 = queuePairs.
             super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar12 = std::
              vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
              ::operator[]((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                            *)local_40,
                           (ulong)(uint)resource.
                                        super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                        .m_data._12_4_);
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)local_138,vk_00,(VkDevice)pQVar4,2,
               pvVar12->familyIndexWrite,(VkAllocationCallbacks *)0x0);
    pQVar4 = queuePairs.
             super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar12 = std::
              vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
              ::operator[]((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                            *)local_40,
                           (ulong)(uint)resource.
                                        super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                        .m_data._12_4_);
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)
               &cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator
               ,vk_00,(VkDevice)pQVar4,2,pvVar12->familyIndexRead,(VkAllocationCallbacks *)0x0);
    pQVar4 = queuePairs.
             super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_138);
    makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)local_188,vk_00,(VkDevice)pQVar4,
                      (VkCommandPool)pHVar13->m_internal);
    pQVar4 = queuePairs.
             super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)24>_> *)
                         &cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                          m_allocator);
    makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)
                      &ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
                      vk_00,(VkDevice)pQVar4,(VkCommandPool)pHVar13->m_internal);
    ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_188);
    unique0x00012000 = *ppVVar14;
    ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)
                          &ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                           m_pool);
    cmdBuffers[0] = *ppVVar14;
    pOVar15 = de::details::
              UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
              ::operator->((UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                            *)local_a0);
    readSync.imageLayout = (*pOVar15->_vptr_Operation[3])();
    register0x00000004 = extraout_var;
    local_1c8 = (undefined1  [8])register0x00000000;
    pOVar15 = de::details::
              UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
              ::operator->((UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                            *)local_d0);
    local_1e8._0_4_ = (*pOVar15->_vptr_Operation[3])();
    local_1e8._4_4_ = extraout_var_00;
    beginCommandBuffer(vk_00,stack0xfffffffffffffe48);
    pOVar15 = de::details::
              UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
              ::operator->((UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                            *)local_a0);
    (*pOVar15->_vptr_Operation[2])(pOVar15,stack0xfffffffffffffe48);
    pRVar10 = de::details::
              UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
              ::operator*((UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                           *)local_58);
    pvVar12 = std::
              vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
              ::operator[]((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                            *)local_40,
                           (ulong)(uint)resource.
                                        super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                        .m_data._12_4_);
    dVar1 = pvVar12->familyIndexWrite;
    pvVar12 = std::
              vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
              ::operator[]((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                            *)local_40,
                           (ulong)(uint)resource.
                                        super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                        .m_data._12_4_);
    createBarrierMultiQueue
              (vk_00,(VkCommandBuffer *)&writeSync.imageLayout,(SyncInfo *)local_1c8,
               (SyncInfo *)local_1e8,pRVar10,dVar1,pvVar12->familyIndexRead,
               *(VkSharingMode *)
                &(this->super_BaseTestInstance).m_writeOp.
                 super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                 .m_data.ptr,false);
    endCommandBuffer(vk_00,stack0xfffffffffffffe48);
    pQVar4 = queuePairs.
             super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar12 = std::
              vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
              ::operator[]((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                            *)local_40,
                           (ulong)(uint)resource.
                                        super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                        .m_data._12_4_);
    submitCommandsAndWait(vk_00,(VkDevice)pQVar4,pvVar12->queueWrite,stack0xfffffffffffffe48);
    beginCommandBuffer(vk_00,cmdBuffers[0]);
    pRVar10 = de::details::
              UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
              ::operator*((UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                           *)local_58);
    pvVar12 = std::
              vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
              ::operator[]((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                            *)local_40,
                           (ulong)(uint)resource.
                                        super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                        .m_data._12_4_);
    dVar1 = pvVar12->familyIndexWrite;
    pvVar12 = std::
              vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
              ::operator[]((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                            *)local_40,
                           (ulong)(uint)resource.
                                        super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                        .m_data._12_4_);
    in_stack_fffffffffffffb48 = pvVar12->familyIndexRead;
    in_stack_fffffffffffffb50 =
         *(VkSharingMode *)
          &(this->super_BaseTestInstance).m_writeOp.
           super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           .m_data.ptr;
    createBarrierMultiQueue
              (vk_00,cmdBuffers,(SyncInfo *)local_1c8,(SyncInfo *)local_1e8,pRVar10,dVar1,
               in_stack_fffffffffffffb48,in_stack_fffffffffffffb50,true);
    pOVar15 = de::details::
              UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
              ::operator->((UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                            *)local_d0);
    (*pOVar15->_vptr_Operation[2])(pOVar15,cmdBuffers[0]);
    endCommandBuffer(vk_00,cmdBuffers[0]);
    pQVar4 = queuePairs.
             super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar12 = std::
              vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
              ::operator[]((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                            *)local_40,
                           (ulong)(uint)resource.
                                        super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                        .m_data._12_4_);
    submitCommandsAndWait(vk_00,(VkDevice)pQVar4,pvVar12->queueRead,cmdBuffers[0]);
    pOVar15 = de::details::
              UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
              ::operator->((UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                            *)local_a0);
    iVar7 = (*pOVar15->_vptr_Operation[4])();
    actual.data = (deUint8 *)CONCAT44(extraout_var_01,iVar7);
    pOVar15 = de::details::
              UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
              ::operator->((UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                            *)local_d0);
    iVar7 = (*pOVar15->_vptr_Operation[4])();
    local_218 = CONCAT44(extraout_var_02,iVar7);
    iVar7 = deMemCmp(a,b,(size_t)actual.data);
    if (iVar7 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"Memory contents don\'t match",&local_239);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::allocator<char>::~allocator(&local_239);
    }
    local_240 = (uint)(iVar7 != 0);
    local_440 = &ptrCmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool;
    do {
      local_440 = local_440 + -4;
      ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move
                ((Move<vk::VkCommandBuffer_s_*> *)local_440);
    } while (local_440 != (VkCommandPool *)local_188);
    local_458 = &cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                 m_allocator;
    do {
      local_458 = local_458 + -4;
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
                ((Move<vk::Handle<(vk::HandleType)24>_> *)local_458);
    } while (local_458 != (VkAllocationCallbacks **)local_138);
    de::details::
    UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    ::~UniquePtr((UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                  *)local_d0);
    de::details::
    UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    ::~UniquePtr((UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                  *)local_a0);
    de::details::
    UniquePtr<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>::
    ~UniquePtr((UniquePtr<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                *)local_58);
    if (local_240 != 0) goto LAB_00e71152;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"OK",&local_261);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  local_240 = 1;
LAB_00e71152:
  std::
  vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
  ::~vector((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
             *)local_40);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	iterate (void)
	{
		enum {WRITE=0, READ, COUNT};
		const DeviceInterface&			vk					= m_context.getDeviceInterface();
		const VkDevice					device				= m_context.getDevice();
		const VkQueue					queue				= m_context.getUniversalQueue();
		const deUint32					queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
		const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
		const Move<VkCommandBuffer>		ptrCmdBuffer[COUNT]	= {makeCommandBuffer(vk, device, *cmdPool), makeCommandBuffer(vk, device, *cmdPool)};
		VkCommandBuffer					cmdBuffers[COUNT]	= {*ptrCmdBuffer[WRITE], *ptrCmdBuffer[READ]};
		const SyncInfo					writeSync			= m_writeOp->getSyncInfo();
		const SyncInfo					readSync			= m_readOp->getSyncInfo();

		beginCommandBuffer(vk, cmdBuffers[WRITE]);

		m_writeOp->recordCommands(cmdBuffers[WRITE]);

		if (m_resource->getType() == RESOURCE_TYPE_IMAGE)
		{
			const VkImageMemoryBarrier barrier =  makeImageMemoryBarrier(writeSync.accessMask, readSync.accessMask,
				writeSync.imageLayout, readSync.imageLayout, m_resource->getImage().handle, m_resource->getImage().subresourceRange);
			vk.cmdPipelineBarrier(cmdBuffers[WRITE],  writeSync.stageMask, readSync.stageMask, (VkDependencyFlags)0, 0u, (const VkMemoryBarrier*)DE_NULL, 0u, (const VkBufferMemoryBarrier*)DE_NULL, 1u, &barrier);
		}

		endCommandBuffer(vk, cmdBuffers[WRITE]);

		submitCommandsAndWait(vk, device, queue, cmdBuffers[WRITE]);

		beginCommandBuffer(vk, cmdBuffers[READ]);

		m_readOp->recordCommands(cmdBuffers[READ]);

		endCommandBuffer(vk, cmdBuffers[READ]);

		submitCommandsAndWait(vk, device, queue, cmdBuffers[READ]);

		{
			const Data	expected = m_writeOp->getData();
			const Data	actual	 = m_readOp->getData();

			if (0 != deMemCmp(expected.data, actual.data, expected.size))
				return tcu::TestStatus::fail("Memory contents don't match");
		}

		return tcu::TestStatus::pass("OK");
	}